

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

U32 duckdb_zstd::ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint uVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  U32 *pUVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar8 = -0x30e44323485a9b9d;
  uVar1 = (ms->cParams).minMatch;
  pUVar2 = ms->hashTable;
  uVar6 = (ms->cParams).chainLog;
  pBVar3 = (ms->window).base;
  uVar10 = (ulong)ms->nextToUpdate;
  uVar7 = (uint)((long)ip - (long)pBVar3);
  cVar5 = (char)(ms->cParams).hashLog;
  if (ms->nextToUpdate < uVar7) {
    pUVar4 = ms->chainTable;
    do {
      switch(uVar1) {
      case 5:
        uVar9 = *(long *)(pBVar3 + uVar10) * -0x30e4432345000000;
        break;
      case 6:
        uVar9 = *(long *)(pBVar3 + uVar10) * -0x30e4432340650000;
        break;
      case 7:
        uVar9 = *(long *)(pBVar3 + uVar10) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar9 = *(long *)(pBVar3 + uVar10) * -0x30e44323485a9b9d;
        break;
      default:
        uVar9 = (ulong)((uint)(*(int *)(pBVar3 + uVar10) * -0x61c8864f) >> (0x20U - cVar5 & 0x1f));
        goto LAB_018e6d3e;
      }
      uVar9 = uVar9 >> (0x40U - cVar5 & 0x3f);
LAB_018e6d3e:
      pUVar4[(uint)uVar10 & ~(-1 << ((byte)uVar6 & 0x1f))] = pUVar2[uVar9];
      pUVar2[uVar9] = (uint)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar10 < ((long)ip - (long)pBVar3 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar7;
  switch(uVar1) {
  case 5:
    lVar8 = -0x30e4432345000000;
    break;
  case 6:
    lVar8 = -0x30e4432340650000;
    break;
  case 7:
    lVar8 = -0x30e44323405a9d00;
    break;
  case 8:
    break;
  default:
    uVar10 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar5 & 0x1fU));
    goto LAB_018e6dbb;
  }
  uVar10 = (ulong)(lVar8 * *(long *)ip) >> (-cVar5 & 0x3fU);
LAB_018e6dbb:
  return pUVar2[uVar10];
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}